

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O0

void idct4_sse2(__m128i *input,__m128i *output)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined4 uVar25;
  int iVar26;
  int iVar27;
  uint uVar28;
  int32_t *piVar29;
  undefined1 (*in_RSI) [16];
  undefined8 *in_RDI;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  __m128i _in1_1;
  __m128i _in0_1;
  __m128i _in1;
  __m128i _in0;
  __m128i d1_1;
  __m128i d0_1;
  __m128i c1_1;
  __m128i c0_1;
  __m128i b1_1;
  __m128i b0_1;
  __m128i a1_1;
  __m128i a0_1;
  __m128i v1_1;
  __m128i v0_1;
  __m128i u1_1;
  __m128i u0_1;
  __m128i t1_1;
  __m128i t0_1;
  __m128i d1;
  __m128i d0;
  __m128i c1;
  __m128i c0;
  __m128i b1;
  __m128i b0;
  __m128i a1;
  __m128i a0;
  __m128i v1;
  __m128i v0;
  __m128i u1;
  __m128i u0;
  __m128i t1;
  __m128i t0;
  __m128i x [4];
  __m128i cospi_p16_p48;
  __m128i cospi_p48_m16;
  __m128i cospi_p32_m32;
  __m128i cospi_p32_p32;
  __m128i __rounding;
  int32_t *cospi;
  int8_t cos_bit;
  undefined2 local_528;
  undefined2 uStack_526;
  undefined2 uStack_524;
  undefined2 uStack_522;
  undefined2 local_518;
  undefined2 uStack_516;
  undefined2 uStack_514;
  undefined2 uStack_512;
  undefined2 local_508;
  undefined2 uStack_506;
  undefined2 uStack_504;
  undefined2 uStack_502;
  undefined2 local_4f8;
  undefined2 uStack_4f6;
  undefined2 uStack_4f4;
  undefined2 uStack_4f2;
  undefined2 uStack_4e0;
  undefined2 uStack_4de;
  undefined2 uStack_4dc;
  undefined2 uStack_4da;
  undefined2 uStack_4d0;
  undefined2 uStack_4ce;
  undefined2 uStack_4cc;
  undefined2 uStack_4ca;
  undefined2 uStack_4c0;
  undefined2 uStack_4be;
  undefined2 uStack_4bc;
  undefined2 uStack_4ba;
  undefined2 uStack_4b0;
  undefined2 uStack_4ae;
  undefined2 uStack_4ac;
  undefined2 uStack_4aa;
  int local_398;
  int iStack_394;
  int iStack_390;
  int iStack_38c;
  int local_378;
  int iStack_374;
  int iStack_370;
  int iStack_36c;
  int local_358;
  int iStack_354;
  int iStack_350;
  int iStack_34c;
  int local_338;
  int iStack_334;
  int iStack_330;
  int iStack_32c;
  int local_318;
  int iStack_314;
  int iStack_310;
  int iStack_30c;
  int local_2f8;
  int iStack_2f4;
  int iStack_2f0;
  int iStack_2ec;
  int local_2d8;
  int iStack_2d4;
  int iStack_2d0;
  int iStack_2cc;
  int local_2b8;
  int iStack_2b4;
  int iStack_2b0;
  int iStack_2ac;
  
  piVar29 = cospi_arr(0xc);
  uVar25 = CONCAT22((short)piVar29[0x20],(short)piVar29[0x20]);
  iVar26 = (piVar29[0x20] & 0xffffU) + piVar29[0x20] * -0x10000;
  iVar27 = (uint)*(ushort *)(piVar29 + 0x30) + piVar29[0x10] * -0x10000;
  uVar28 = (uint)*(ushort *)(piVar29 + 0x10) | piVar29[0x30] << 0x10;
  uVar1 = *in_RDI;
  uVar2 = in_RDI[1];
  uVar3 = in_RDI[4];
  uVar4 = in_RDI[5];
  uVar5 = in_RDI[2];
  uVar6 = in_RDI[3];
  uVar7 = in_RDI[6];
  uVar8 = in_RDI[7];
  local_4f8 = (undefined2)uVar1;
  uStack_4f6 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_4f4 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_4f2 = (undefined2)((ulong)uVar1 >> 0x30);
  local_508 = (undefined2)uVar3;
  uStack_506 = (undefined2)((ulong)uVar3 >> 0x10);
  uStack_504 = (undefined2)((ulong)uVar3 >> 0x20);
  uStack_502 = (undefined2)((ulong)uVar3 >> 0x30);
  uStack_4b0 = (undefined2)uVar2;
  uStack_4ae = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_4ac = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_4aa = (undefined2)((ulong)uVar2 >> 0x30);
  uStack_4c0 = (undefined2)uVar4;
  uStack_4be = (undefined2)((ulong)uVar4 >> 0x10);
  uStack_4bc = (undefined2)((ulong)uVar4 >> 0x20);
  uStack_4ba = (undefined2)((ulong)uVar4 >> 0x30);
  auVar16._2_2_ = local_508;
  auVar16._0_2_ = local_4f8;
  auVar16._4_2_ = uStack_4f6;
  auVar16._6_2_ = uStack_506;
  auVar16._10_2_ = uStack_504;
  auVar16._8_2_ = uStack_4f4;
  auVar16._12_2_ = uStack_4f2;
  auVar16._14_2_ = uStack_502;
  auVar15._8_8_ = CONCAT44(uVar25,uVar25);
  auVar15._0_8_ = CONCAT44(uVar25,uVar25);
  auVar30 = pmaddwd(auVar16,auVar15);
  auVar14._2_2_ = uStack_4c0;
  auVar14._0_2_ = uStack_4b0;
  auVar14._4_2_ = uStack_4ae;
  auVar14._6_2_ = uStack_4be;
  auVar14._10_2_ = uStack_4bc;
  auVar14._8_2_ = uStack_4ac;
  auVar14._12_2_ = uStack_4aa;
  auVar14._14_2_ = uStack_4ba;
  auVar13._8_8_ = CONCAT44(uVar25,uVar25);
  auVar13._0_8_ = CONCAT44(uVar25,uVar25);
  auVar31 = pmaddwd(auVar14,auVar13);
  auVar12._2_2_ = local_508;
  auVar12._0_2_ = local_4f8;
  auVar12._4_2_ = uStack_4f6;
  auVar12._6_2_ = uStack_506;
  auVar12._10_2_ = uStack_504;
  auVar12._8_2_ = uStack_4f4;
  auVar12._12_2_ = uStack_4f2;
  auVar12._14_2_ = uStack_502;
  auVar11._8_8_ = CONCAT44(iVar26,iVar26);
  auVar11._0_8_ = CONCAT44(iVar26,iVar26);
  auVar32 = pmaddwd(auVar12,auVar11);
  auVar35._2_2_ = uStack_4c0;
  auVar35._0_2_ = uStack_4b0;
  auVar35._4_2_ = uStack_4ae;
  auVar35._6_2_ = uStack_4be;
  auVar35._10_2_ = uStack_4bc;
  auVar35._8_2_ = uStack_4ac;
  auVar35._12_2_ = uStack_4aa;
  auVar35._14_2_ = uStack_4ba;
  auVar34._8_8_ = CONCAT44(iVar26,iVar26);
  auVar34._0_8_ = CONCAT44(iVar26,iVar26);
  auVar33 = pmaddwd(auVar35,auVar34);
  local_2b8 = auVar30._0_4_;
  iStack_2b4 = auVar30._4_4_;
  iStack_2b0 = auVar30._8_4_;
  iStack_2ac = auVar30._12_4_;
  local_2d8 = auVar31._0_4_;
  iStack_2d4 = auVar31._4_4_;
  iStack_2d0 = auVar31._8_4_;
  iStack_2cc = auVar31._12_4_;
  local_2f8 = auVar32._0_4_;
  iStack_2f4 = auVar32._4_4_;
  iStack_2f0 = auVar32._8_4_;
  iStack_2ec = auVar32._12_4_;
  local_318 = auVar33._0_4_;
  iStack_314 = auVar33._4_4_;
  iStack_310 = auVar33._8_4_;
  iStack_30c = auVar33._12_4_;
  auVar30 = ZEXT416(0xc);
  auVar31 = ZEXT416(0xc);
  auVar32 = ZEXT416(0xc);
  auVar33 = ZEXT416(0xc);
  auVar24._4_4_ = iStack_2b4 + 0x800 >> auVar30;
  auVar24._0_4_ = local_2b8 + 0x800 >> auVar30;
  auVar24._12_4_ = iStack_2ac + 0x800 >> auVar30;
  auVar24._8_4_ = iStack_2b0 + 0x800 >> auVar30;
  auVar23._4_4_ = iStack_2d4 + 0x800 >> auVar31;
  auVar23._0_4_ = local_2d8 + 0x800 >> auVar31;
  auVar23._12_4_ = iStack_2cc + 0x800 >> auVar31;
  auVar23._8_4_ = iStack_2d0 + 0x800 >> auVar31;
  auVar34 = packssdw(auVar24,auVar23);
  auVar22._4_4_ = iStack_2f4 + 0x800 >> auVar32;
  auVar22._0_4_ = local_2f8 + 0x800 >> auVar32;
  auVar22._12_4_ = iStack_2ec + 0x800 >> auVar32;
  auVar22._8_4_ = iStack_2f0 + 0x800 >> auVar32;
  auVar21._4_4_ = iStack_314 + 0x800 >> auVar33;
  auVar21._0_4_ = local_318 + 0x800 >> auVar33;
  auVar21._12_4_ = iStack_30c + 0x800 >> auVar33;
  auVar21._8_4_ = iStack_310 + 0x800 >> auVar33;
  auVar35 = packssdw(auVar22,auVar21);
  local_518 = (undefined2)uVar5;
  uStack_516 = (undefined2)((ulong)uVar5 >> 0x10);
  uStack_514 = (undefined2)((ulong)uVar5 >> 0x20);
  uStack_512 = (undefined2)((ulong)uVar5 >> 0x30);
  local_528 = (undefined2)uVar7;
  uStack_526 = (undefined2)((ulong)uVar7 >> 0x10);
  uStack_524 = (undefined2)((ulong)uVar7 >> 0x20);
  uStack_522 = (undefined2)((ulong)uVar7 >> 0x30);
  uStack_4d0 = (undefined2)uVar6;
  uStack_4ce = (undefined2)((ulong)uVar6 >> 0x10);
  uStack_4cc = (undefined2)((ulong)uVar6 >> 0x20);
  uStack_4ca = (undefined2)((ulong)uVar6 >> 0x30);
  uStack_4e0 = (undefined2)uVar8;
  uStack_4de = (undefined2)((ulong)uVar8 >> 0x10);
  uStack_4dc = (undefined2)((ulong)uVar8 >> 0x20);
  uStack_4da = (undefined2)((ulong)uVar8 >> 0x30);
  auVar10._2_2_ = local_528;
  auVar10._0_2_ = local_518;
  auVar10._4_2_ = uStack_516;
  auVar10._6_2_ = uStack_526;
  auVar10._10_2_ = uStack_524;
  auVar10._8_2_ = uStack_514;
  auVar10._12_2_ = uStack_512;
  auVar10._14_2_ = uStack_522;
  auVar36._8_8_ = CONCAT44(iVar27,iVar27);
  auVar36._0_8_ = CONCAT44(iVar27,iVar27);
  auVar36 = pmaddwd(auVar10,auVar36);
  auVar9._2_2_ = uStack_4e0;
  auVar9._0_2_ = uStack_4d0;
  auVar9._4_2_ = uStack_4ce;
  auVar9._6_2_ = uStack_4de;
  auVar9._10_2_ = uStack_4dc;
  auVar9._8_2_ = uStack_4cc;
  auVar9._12_2_ = uStack_4ca;
  auVar9._14_2_ = uStack_4da;
  auVar37._8_8_ = CONCAT44(iVar27,iVar27);
  auVar37._0_8_ = CONCAT44(iVar27,iVar27);
  auVar37 = pmaddwd(auVar9,auVar37);
  auVar33._2_2_ = local_528;
  auVar33._0_2_ = local_518;
  auVar33._4_2_ = uStack_516;
  auVar33._6_2_ = uStack_526;
  auVar33._10_2_ = uStack_524;
  auVar33._8_2_ = uStack_514;
  auVar33._12_2_ = uStack_512;
  auVar33._14_2_ = uStack_522;
  auVar32._8_8_ = CONCAT44(uVar28,uVar28);
  auVar32._0_8_ = CONCAT44(uVar28,uVar28);
  auVar32 = pmaddwd(auVar33,auVar32);
  auVar31._2_2_ = uStack_4e0;
  auVar31._0_2_ = uStack_4d0;
  auVar31._4_2_ = uStack_4ce;
  auVar31._6_2_ = uStack_4de;
  auVar31._10_2_ = uStack_4dc;
  auVar31._8_2_ = uStack_4cc;
  auVar31._12_2_ = uStack_4ca;
  auVar31._14_2_ = uStack_4da;
  auVar30._8_8_ = CONCAT44(uVar28,uVar28);
  auVar30._0_8_ = CONCAT44(uVar28,uVar28);
  auVar30 = pmaddwd(auVar31,auVar30);
  local_338 = auVar36._0_4_;
  iStack_334 = auVar36._4_4_;
  iStack_330 = auVar36._8_4_;
  iStack_32c = auVar36._12_4_;
  local_358 = auVar37._0_4_;
  iStack_354 = auVar37._4_4_;
  iStack_350 = auVar37._8_4_;
  iStack_34c = auVar37._12_4_;
  local_378 = auVar32._0_4_;
  iStack_374 = auVar32._4_4_;
  iStack_370 = auVar32._8_4_;
  iStack_36c = auVar32._12_4_;
  local_398 = auVar30._0_4_;
  iStack_394 = auVar30._4_4_;
  iStack_390 = auVar30._8_4_;
  iStack_38c = auVar30._12_4_;
  auVar30 = ZEXT416(0xc);
  auVar31 = ZEXT416(0xc);
  auVar32 = ZEXT416(0xc);
  auVar33 = ZEXT416(0xc);
  auVar20._4_4_ = iStack_334 + 0x800 >> auVar30;
  auVar20._0_4_ = local_338 + 0x800 >> auVar30;
  auVar20._12_4_ = iStack_32c + 0x800 >> auVar30;
  auVar20._8_4_ = iStack_330 + 0x800 >> auVar30;
  auVar19._4_4_ = iStack_354 + 0x800 >> auVar31;
  auVar19._0_4_ = local_358 + 0x800 >> auVar31;
  auVar19._12_4_ = iStack_34c + 0x800 >> auVar31;
  auVar19._8_4_ = iStack_350 + 0x800 >> auVar31;
  auVar30 = packssdw(auVar20,auVar19);
  auVar18._4_4_ = iStack_374 + 0x800 >> auVar32;
  auVar18._0_4_ = local_378 + 0x800 >> auVar32;
  auVar18._12_4_ = iStack_36c + 0x800 >> auVar32;
  auVar18._8_4_ = iStack_370 + 0x800 >> auVar32;
  auVar17._4_4_ = iStack_394 + 0x800 >> auVar33;
  auVar17._0_4_ = local_398 + 0x800 >> auVar33;
  auVar17._12_4_ = iStack_38c + 0x800 >> auVar33;
  auVar17._8_4_ = iStack_390 + 0x800 >> auVar33;
  auVar31 = packssdw(auVar18,auVar17);
  auVar32 = paddsw(auVar34,auVar31);
  *in_RSI = auVar32;
  auVar31 = psubsw(auVar34,auVar31);
  in_RSI[3] = auVar31;
  auVar31 = paddsw(auVar35,auVar30);
  in_RSI[1] = auVar31;
  auVar30 = psubsw(auVar35,auVar30);
  in_RSI[2] = auVar30;
  return;
}

Assistant:

static void idct4_sse2(const __m128i *input, __m128i *output) {
  const int8_t cos_bit = INV_COS_BIT;
  const int32_t *cospi = cospi_arr(INV_COS_BIT);
  const __m128i __rounding = _mm_set1_epi32(1 << (INV_COS_BIT - 1));

  const __m128i cospi_p32_p32 = pair_set_epi16(cospi[32], cospi[32]);
  const __m128i cospi_p32_m32 = pair_set_epi16(cospi[32], -cospi[32]);
  const __m128i cospi_p48_m16 = pair_set_epi16(cospi[48], -cospi[16]);
  const __m128i cospi_p16_p48 = pair_set_epi16(cospi[16], cospi[48]);

  // stage 1
  __m128i x[4];
  x[0] = input[0];
  x[1] = input[2];
  x[2] = input[1];
  x[3] = input[3];

  // stage 2
  btf_16_sse2(cospi_p32_p32, cospi_p32_m32, x[0], x[1], x[0], x[1]);
  btf_16_sse2(cospi_p48_m16, cospi_p16_p48, x[2], x[3], x[2], x[3]);

  // stage 3
  btf_16_adds_subs_out_sse2(output[0], output[3], x[0], x[3]);
  btf_16_adds_subs_out_sse2(output[1], output[2], x[1], x[2]);
}